

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emt.c
# Opt level: O0

void emtlini(emtcxdef *ctx)

{
  int iVar1;
  int max;
  emtldef *p;
  int i;
  emtcxdef *ctx_local;
  
  iVar1 = ctx->emtcxlcnt;
  p = ctx->emtcxlbl;
  for (i = 1; i < iVar1; i = i + 1) {
    p->emtllnk = (ushort)i;
    p = p + 1;
  }
  p->emtllnk = 0xffff;
  ctx->emtcxlfre = 0;
  return;
}

Assistant:

void emtlini(emtcxdef *ctx)
{
    int      i;
    emtldef *p;
    int      max;
    
    for (max = ctx->emtcxlcnt, i = 1, p = ctx->emtcxlbl ; i < max ; ++p, ++i)
        p->emtllnk = i;
    p->emtllnk = EMTLLNKEND;
    ctx->emtcxlfre = 0;
}